

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void luaV_execute(lua_State *L)

{
  lua_CFunction *pp_Var1;
  double dVar2;
  byte bVar3;
  lua_CFunction p_Var4;
  StkId pTVar5;
  global_State *p;
  Upvaldesc *pUVar6;
  Value *pVVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  TValue *pTVar11;
  GCObject *pGVar12;
  UpVal *pUVar13;
  uint *puVar14;
  StkId pTVar15;
  code *pcVar16;
  int *piVar17;
  StkId pTVar18;
  Instruction *pIVar19;
  TValue *io2_3;
  undefined4 *puVar20;
  TValue *pTVar21;
  StkId pTVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  TValue *io1;
  TValue *pTVar27;
  ulong uVar28;
  char *fmt;
  int iVar29;
  TMS TVar30;
  CallInfo *pCVar31;
  TValue *io;
  lu_byte *plVar32;
  int a;
  uint uVar33;
  CallInfo *pCVar34;
  uint uVar35;
  Upvaldesc *uv;
  lua_Number lVar36;
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  
  pCVar31 = L->ci;
LAB_00112697:
  pTVar18 = (pCVar31->u).l.base;
  p_Var4 = (pCVar31->func->value_).f;
  pTVar5 = *(StkId *)(*(long *)(p_Var4 + 0x18) + 0x10);
LAB_001126b8:
  do {
    puVar14 = (pCVar31->u).l.savedpc;
    (pCVar31->u).l.savedpc = puVar14 + 1;
    uVar35 = *puVar14;
    bVar3 = L->hookmask;
    if ((bVar3 & 0xc) != 0) {
      piVar17 = &L->hookcount;
      *piVar17 = *piVar17 + -1;
      if (*piVar17 == 0) {
        pCVar34 = L->ci;
        if ((bVar3 & 8) == 0) goto LAB_001126f4;
        L->hookcount = L->basehookcount;
        plVar32 = &pCVar34->callstatus;
        bVar9 = pCVar34->callstatus;
        if ((char)bVar9 < '\0') goto LAB_0011276b;
        luaD_hook(L,3,-1);
        bVar8 = true;
LAB_00112732:
        if ((bVar3 & 4) != 0) {
          pIVar19 = (pCVar34->u).l.savedpc;
          lVar25 = *(long *)((pCVar34->func->value_).f + 0x18);
          lVar24 = *(long *)(lVar25 + 0x18);
          lVar25 = *(long *)(lVar25 + 0x28);
          iVar29 = (int)((ulong)((long)pIVar19 - lVar24) >> 2) + -1;
          if (lVar25 == 0) {
            iVar10 = 0;
          }
          else {
            iVar10 = *(int *)(lVar25 + (long)iVar29 * 4);
          }
          if ((iVar29 != 0) && (L->oldpc < pIVar19)) {
            if (lVar25 == 0) {
              iVar29 = 0;
            }
            else {
              iVar29 = *(int *)(lVar25 + (((long)L->oldpc - lVar24) * 0x40000000 + -0x100000000 >>
                                         0x20) * 4);
            }
            if (iVar10 == iVar29) goto LAB_001127c0;
          }
          luaD_hook(L,2,iVar10);
        }
LAB_001127c0:
        pIVar19 = (pCVar34->u).l.savedpc;
        L->oldpc = pIVar19;
        if (L->status == '\x01') {
          if (bVar8) {
            L->hookcount = 1;
            pIVar19 = (pCVar34->u).l.savedpc;
          }
          (pCVar34->u).l.savedpc = pIVar19 + -1;
          *plVar32 = *plVar32 | 0x80;
          pCVar34->func = L->top + -1;
          luaD_throw(L,1);
        }
      }
      else {
        if ((bVar3 & 4) == 0) goto LAB_001127d6;
        pCVar34 = L->ci;
LAB_001126f4:
        plVar32 = &pCVar34->callstatus;
        bVar9 = pCVar34->callstatus;
        if (-1 < (char)bVar9) {
          bVar8 = false;
          goto LAB_00112732;
        }
LAB_0011276b:
        *plVar32 = bVar9 & 0x7f;
      }
      pTVar18 = (pCVar31->u).l.base;
    }
LAB_001127d6:
  } while (0x26 < (uVar35 & 0x3f));
  uVar33 = uVar35 >> 6 & 0xff;
  pTVar27 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 << 4));
  pTVar15 = pTVar18;
  switch(uVar35 & 0x3f) {
  case 0:
    uVar28 = (ulong)(uVar35 >> 0x13 & 0xfffffff0);
    pTVar27->value_ = *(Value *)((long)&pTVar18->value_ + uVar28);
    pTVar27->tt_ = *(int *)((long)&pTVar18->tt_ + uVar28);
    goto LAB_001126b8;
  case 1:
    uVar28 = (ulong)(uVar35 >> 10 & 0xfffffff0);
    pTVar27->value_ = *(Value *)((long)&pTVar5->value_ + uVar28);
    pTVar27->tt_ = *(int *)((long)&pTVar5->tt_ + uVar28);
    goto LAB_001126b8;
  case 2:
    puVar14 = (pCVar31->u).l.savedpc;
    (pCVar31->u).l.savedpc = puVar14 + 1;
    uVar28 = (ulong)(*puVar14 >> 2 & 0xfffffff0);
    pTVar27->value_ = *(Value *)((long)&pTVar5->value_ + uVar28);
    pTVar27->tt_ = *(int *)((long)&pTVar5->tt_ + uVar28);
    goto LAB_001126b8;
  case 3:
    (pTVar27->value_).b = uVar35 >> 0x17;
    pTVar27->tt_ = 1;
    if ((uVar35 & 0x7fc000) != 0) goto LAB_00112e17;
    goto LAB_001126b8;
  case 4:
    uVar35 = uVar35 >> 0x17;
    auVar39._4_4_ = 0;
    auVar39._0_4_ = uVar35;
    auVar39._8_4_ = uVar35;
    auVar39._12_4_ = 0;
    puVar20 = (undefined4 *)((long)&pTVar18[3].tt_ + (ulong)(uVar33 << 4));
    uVar28 = 0;
    do {
      auVar41 = _DAT_0011d020;
      auVar40._8_4_ = (int)uVar28;
      auVar40._0_8_ = uVar28;
      auVar40._12_4_ = (int)(uVar28 >> 0x20);
      auVar42 = auVar39 | _DAT_0011d020;
      auVar43 = (_DAT_0011d010 | auVar40) ^ _DAT_0011d020;
      iVar29 = auVar42._4_4_;
      if ((bool)(~(auVar43._4_4_ == iVar29 && auVar42._0_4_ < auVar43._0_4_ ||
                  iVar29 < auVar43._4_4_) & 1)) {
        puVar20[-0xc] = 0;
      }
      if ((auVar43._12_4_ != auVar42._12_4_ || auVar43._8_4_ <= auVar42._8_4_) &&
          auVar43._12_4_ <= auVar42._12_4_) {
        puVar20[-8] = 0;
      }
      auVar41 = (auVar40 | _DAT_0011d000) ^ auVar41;
      iVar10 = auVar41._4_4_;
      if (iVar10 <= iVar29 && (iVar10 != iVar29 || auVar41._0_4_ <= auVar42._0_4_)) {
        puVar20[-4] = 0;
        *puVar20 = 0;
      }
      uVar28 = uVar28 + 4;
      puVar20 = puVar20 + 0x10;
    } while ((uVar35 + 4 & 0xfffffffc) != uVar28);
    goto LAB_001126b8;
  case 5:
    pVVar7 = *(Value **)(*(long *)(p_Var4 + (ulong)(uVar35 >> 0x17) * 8 + 0x20) + 0x10);
    pTVar27->value_ = *pVVar7;
    pTVar27->tt_ = pVVar7[1].b;
    goto LAB_001126b8;
  case 6:
    if ((uVar35 >> 0x16 & 1) != 0) {
      pTVar18 = pTVar5;
    }
    pTVar11 = *(TValue **)(*(long *)(p_Var4 + (ulong)(uVar35 >> 0x17) * 8 + 0x20) + 0x10);
    pTVar15 = pTVar18;
    goto LAB_00113107;
  case 7:
    pTVar11 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0));
    if ((uVar35 >> 0x16 & 1) != 0) {
      pTVar15 = pTVar5;
    }
    goto LAB_00113107;
  case 8:
    pTVar11 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0));
    if ((int)uVar35 < 0) {
      pTVar11 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar35 >> 0x13 & 0xff0));
    }
    if ((uVar35 >> 0x16 & 1) != 0) {
      pTVar18 = pTVar5;
    }
    pTVar27 = *(TValue **)(*(long *)(p_Var4 + (ulong)uVar33 * 8 + 0x20) + 0x10);
    pTVar18 = (StkId)((long)&pTVar18->value_ + (ulong)(uVar35 >> 10 & 0xff0));
    goto LAB_00113221;
  case 9:
    pGVar12 = *(GCObject **)(p_Var4 + (ulong)(uVar35 >> 0x17) * 8 + 0x20);
    pTVar11 = (pGVar12->h).array;
    pTVar11->value_ = pTVar27->value_;
    uVar35 = pTVar27->tt_;
    pTVar11->tt_ = uVar35;
    if ((((uVar35 & 0x40) != 0) && (((((pTVar27->value_).gc)->gch).marked & 3) != 0)) &&
       (((pGVar12->gch).marked & 4) != 0)) {
      luaC_barrier_(L,pGVar12,(pTVar27->value_).gc);
    }
    goto LAB_001126b8;
  case 10:
    pTVar11 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0));
    if ((int)uVar35 < 0) {
      pTVar11 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar35 >> 0x13 & 0xff0));
    }
    if ((uVar35 >> 0x16 & 1) != 0) {
      pTVar18 = pTVar5;
    }
    pTVar18 = (StkId)((long)&pTVar18->value_ + (ulong)(uVar35 >> 10 & 0xff0));
LAB_00113221:
    luaV_settable(L,pTVar27,pTVar11,pTVar18);
    break;
  case 0xb:
    pGVar12 = (GCObject *)luaH_new(L);
    uVar33 = uVar35 >> 0xe & 0x1ff;
    (pTVar27->value_).gc = pGVar12;
    pTVar27->tt_ = 0x45;
    if (uVar33 != 0 || 0x7fffff < uVar35) {
      iVar29 = luaO_fb2int(uVar35 >> 0x17);
      iVar10 = luaO_fb2int(uVar33);
      luaH_resize(L,&pGVar12->h,iVar29,iVar10);
    }
    if (0 < L->l_G->GCdebt) {
      L->top = pTVar27 + 1;
      luaC_step(L);
      L->top = pCVar31->top;
    }
    pTVar18 = (pCVar31->u).l.base;
    goto LAB_001126b8;
  case 0xc:
    uVar28 = (ulong)(uVar35 >> 0x13 & 0xfffffff0);
    pTVar11 = (TValue *)((long)&pTVar18->value_ + uVar28);
    pTVar27[1].value_ = *(Value *)((long)&pTVar18->value_ + uVar28);
    if ((uVar35 >> 0x16 & 1) != 0) {
      pTVar15 = pTVar5;
    }
    pTVar27[1].tt_ = *(int *)((long)&pTVar18->tt_ + uVar28);
LAB_00113107:
    luaV_gettable(L,pTVar11,(TValue *)((long)&pTVar15->value_ + (ulong)(uVar35 >> 10 & 0xff0)),
                  pTVar27);
    break;
  case 0xd:
    pTVar21 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0));
    if ((int)uVar35 < 0) {
      pTVar21 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar35 >> 0x13 & 0xff0));
    }
    pTVar15 = pTVar5;
    if ((uVar35 >> 0x16 & 1) == 0) {
      pTVar15 = pTVar18;
    }
    pTVar11 = (TValue *)((long)&pTVar15->value_ + (ulong)(uVar35 >> 10 & 0xff0));
    if ((pTVar21->tt_ != 3) || (pTVar11->tt_ != 3)) {
      TVar30 = TM_ADD;
      goto LAB_00113784;
    }
    lVar36 = (pTVar21->value_).n + (pTVar11->value_).n;
LAB_001130d4:
    (pTVar27->value_).n = lVar36;
    pTVar27->tt_ = 3;
    goto LAB_001126b8;
  case 0xe:
    pTVar21 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0));
    if ((int)uVar35 < 0) {
      pTVar21 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar35 >> 0x13 & 0xff0));
    }
    pTVar15 = pTVar5;
    if ((uVar35 >> 0x16 & 1) == 0) {
      pTVar15 = pTVar18;
    }
    pTVar11 = (TValue *)((long)&pTVar15->value_ + (ulong)(uVar35 >> 10 & 0xff0));
    if ((pTVar21->tt_ == 3) && (pTVar11->tt_ == 3)) {
      lVar36 = (pTVar21->value_).n - (pTVar11->value_).n;
      goto LAB_001130d4;
    }
    TVar30 = TM_SUB;
    goto LAB_00113784;
  case 0xf:
    pTVar21 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0));
    if ((int)uVar35 < 0) {
      pTVar21 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar35 >> 0x13 & 0xff0));
    }
    pTVar15 = pTVar5;
    if ((uVar35 >> 0x16 & 1) == 0) {
      pTVar15 = pTVar18;
    }
    pTVar11 = (TValue *)((long)&pTVar15->value_ + (ulong)(uVar35 >> 10 & 0xff0));
    if ((pTVar21->tt_ == 3) && (pTVar11->tt_ == 3)) {
      lVar36 = (pTVar21->value_).n * (pTVar11->value_).n;
      goto LAB_001130d4;
    }
    TVar30 = TM_MUL;
    goto LAB_00113784;
  case 0x10:
    pTVar21 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0));
    if ((int)uVar35 < 0) {
      pTVar21 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar35 >> 0x13 & 0xff0));
    }
    pTVar15 = pTVar5;
    if ((uVar35 >> 0x16 & 1) == 0) {
      pTVar15 = pTVar18;
    }
    pTVar11 = (TValue *)((long)&pTVar15->value_ + (ulong)(uVar35 >> 10 & 0xff0));
    if ((pTVar21->tt_ == 3) && (pTVar11->tt_ == 3)) {
      lVar36 = (pTVar21->value_).n / (pTVar11->value_).n;
      goto LAB_001130d4;
    }
    TVar30 = TM_DIV;
    goto LAB_00113784;
  case 0x11:
    pTVar11 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0));
    if ((int)uVar35 < 0) {
      pTVar11 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar35 >> 0x13 & 0xff0));
    }
    pTVar15 = pTVar5;
    if ((uVar35 >> 0x16 & 1) == 0) {
      pTVar15 = pTVar18;
    }
    pTVar21 = (TValue *)((long)&pTVar15->value_ + (ulong)(uVar35 >> 10 & 0xff0));
    if ((pTVar11->tt_ == 3) && (pTVar21->tt_ == 3)) {
      dVar38 = (pTVar11->value_).n;
      dVar2 = (pTVar21->value_).n;
      dVar37 = floor(dVar38 / dVar2);
      (pTVar27->value_).n = dVar38 - dVar37 * dVar2;
      goto LAB_0011318d;
    }
    TVar30 = TM_MOD;
LAB_0011353f:
    luaV_arith(L,pTVar27,pTVar11,pTVar21,TVar30);
    break;
  case 0x12:
    pTVar11 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0));
    if ((int)uVar35 < 0) {
      pTVar11 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar35 >> 0x13 & 0xff0));
    }
    pTVar15 = pTVar5;
    if ((uVar35 >> 0x16 & 1) == 0) {
      pTVar15 = pTVar18;
    }
    pTVar21 = (TValue *)((long)&pTVar15->value_ + (ulong)(uVar35 >> 10 & 0xff0));
    if ((pTVar11->tt_ != 3) || (pTVar21->tt_ != 3)) {
      TVar30 = TM_POW;
      goto LAB_0011353f;
    }
    dVar38 = pow((pTVar11->value_).n,(pTVar21->value_).n);
    (pTVar27->value_).n = dVar38;
LAB_0011318d:
    pTVar27->tt_ = 3;
    goto LAB_001126b8;
  case 0x13:
    uVar28 = (ulong)(uVar35 >> 0x13 & 0xfffffff0);
    pTVar11 = (TValue *)((long)&pTVar18->value_ + uVar28);
    if (*(int *)((long)&pTVar18->tt_ + uVar28) == 3) {
      (pTVar27->value_).gc = (GCObject *)((ulong)(pTVar11->value_).gc ^ 0x8000000000000000);
      pTVar27->tt_ = 3;
      goto LAB_001126b8;
    }
    TVar30 = TM_UNM;
    pTVar21 = pTVar11;
LAB_00113784:
    luaV_arith(L,pTVar27,pTVar21,pTVar11,TVar30);
    break;
  case 0x14:
    uVar28 = (ulong)(uVar35 >> 0x13 & 0xfffffff0);
    iVar29 = *(int *)((long)&pTVar18->tt_ + uVar28);
    if (iVar29 == 0) {
      uVar35 = 1;
    }
    else if (iVar29 == 1) {
      uVar35 = (uint)(*(int *)((long)&pTVar18->value_ + uVar28) == 0);
    }
    else {
      uVar35 = 0;
    }
    *(uint *)&pTVar27->value_ = uVar35;
    pTVar27->tt_ = 1;
    goto LAB_001126b8;
  case 0x15:
    luaV_objlen(L,pTVar27,(TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0)))
    ;
    break;
  case 0x16:
    uVar26 = uVar35 >> 0x17;
    uVar35 = uVar35 >> 0xe & 0x1ff;
    L->top = (StkId)((long)&pTVar18[1].value_ + (ulong)(uVar35 << 4));
    luaV_concat(L,(uVar35 - uVar26) + 1);
    pTVar18 = (pCVar31->u).l.base;
    uVar28 = (ulong)(uVar33 << 4);
    uVar23 = (ulong)(uVar26 << 4);
    *(undefined8 *)((long)&pTVar18->value_ + uVar28) =
         *(undefined8 *)((long)&pTVar18->value_ + uVar23);
    *(undefined4 *)((long)&pTVar18->tt_ + uVar28) = *(undefined4 *)((long)&pTVar18->tt_ + uVar23);
    if (L->l_G->GCdebt < 1) {
      pTVar15 = pCVar31->top;
    }
    else {
      pTVar15 = (StkId)((long)&pTVar18[1].value_ + uVar28);
      if (uVar33 < uVar26) {
        pTVar15 = (StkId)((long)&pTVar18->value_ + uVar23);
      }
      L->top = pTVar15;
      luaC_step(L);
      pTVar15 = pCVar31->top;
      L->top = pTVar15;
    }
    pTVar18 = (pCVar31->u).l.base;
    L->top = pTVar15;
    goto LAB_001126b8;
  case 0x17:
    if (uVar33 != 0) {
      luaF_close(L,(StkId)((long)&(pCVar31->u).l.base[-1].value_ + (ulong)(uVar33 << 4)));
    }
    goto LAB_00113398;
  case 0x18:
    pTVar27 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0));
    if ((int)uVar35 < 0) {
      pTVar27 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar35 >> 0x13 & 0xff0));
    }
    if ((uVar35 >> 0x16 & 1) != 0) {
      pTVar18 = pTVar5;
    }
    uVar28 = (ulong)(uVar35 >> 10 & 0xff0);
    uVar35 = 0;
    if (pTVar27->tt_ == *(int *)((long)&pTVar18->tt_ + uVar28)) {
      iVar29 = luaV_equalobj_(L,pTVar27,(TValue *)((long)&pTVar18->value_ + uVar28));
      uVar35 = (uint)(iVar29 != 0);
    }
    puVar14 = (pCVar31->u).l.savedpc;
    if (uVar35 == uVar33) {
      uVar35 = *puVar14;
      uVar33 = uVar35 >> 6 & 0xff;
      if (uVar33 != 0) {
        luaF_close(L,(StkId)((long)&(pCVar31->u).l.base[-1].value_ + (ulong)(uVar33 << 4)));
        puVar14 = (pCVar31->u).l.savedpc;
      }
      puVar14 = puVar14 + ((ulong)(uVar35 >> 0xe) - 0x1fffe);
    }
    else {
      puVar14 = puVar14 + 1;
    }
    (pCVar31->u).l.savedpc = puVar14;
    break;
  case 0x19:
    pTVar27 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0));
    if ((int)uVar35 < 0) {
      pTVar27 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar35 >> 0x13 & 0xff0));
    }
    if ((uVar35 >> 0x16 & 1) != 0) {
      pTVar18 = pTVar5;
    }
    uVar35 = luaV_lessthan(L,pTVar27,
                           (TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 10 & 0xff0)));
    goto LAB_00113481;
  case 0x1a:
    pTVar27 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0));
    if ((int)uVar35 < 0) {
      pTVar27 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar35 >> 0x13 & 0xff0));
    }
    if ((uVar35 >> 0x16 & 1) != 0) {
      pTVar18 = pTVar5;
    }
    uVar35 = luaV_lessequal(L,pTVar27,
                            (TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 10 & 0xff0)));
LAB_00113481:
    puVar14 = (pCVar31->u).l.savedpc;
    if (uVar35 == uVar33) {
      uVar35 = *puVar14;
      uVar33 = uVar35 >> 6 & 0xff;
      if (uVar33 != 0) {
        luaF_close(L,(StkId)((long)&(pCVar31->u).l.base[-1].value_ + (ulong)(uVar33 << 4)));
        puVar14 = (pCVar31->u).l.savedpc;
      }
      puVar14 = puVar14 + ((ulong)(uVar35 >> 0xe) - 0x1fffe);
    }
    else {
      puVar14 = puVar14 + 1;
    }
    (pCVar31->u).l.savedpc = puVar14;
    break;
  case 0x1b:
    iVar29 = pTVar27->tt_;
    if ((uVar35 & 0x7fc000) == 0) {
      if ((iVar29 == 0) || ((iVar29 == 1 && ((pTVar27->value_).b == 0)))) goto LAB_0011380b;
    }
    else if ((iVar29 != 0) && ((iVar29 != 1 || ((pTVar27->value_).b != 0)))) goto LAB_0011380b;
LAB_00112e17:
    pp_Var1 = &(pCVar31->u).c.k;
    *pp_Var1 = *pp_Var1 + 4;
    goto LAB_001126b8;
  case 0x1c:
    uVar28 = (ulong)(uVar35 >> 0x13 & 0xfffffff0);
    pVVar7 = (Value *)((long)&pTVar18->value_ + uVar28);
    iVar29 = *(int *)((long)&pTVar18->tt_ + uVar28);
    if ((uVar35 & 0x7fc000) == 0) {
      if (iVar29 != 0) {
        if ((iVar29 != 1) || (pVVar7->b != 0)) goto LAB_001137d5;
        iVar29 = 1;
      }
LAB_001137ff:
      pTVar27->value_ = *pVVar7;
      pTVar27->tt_ = iVar29;
LAB_0011380b:
      puVar14 = (pCVar31->u).l.savedpc;
      uVar35 = *puVar14;
      uVar33 = uVar35 >> 6 & 0xff;
      if (uVar33 != 0) {
        luaF_close(L,(StkId)((long)&(pCVar31->u).l.base[-1].value_ + (ulong)(uVar33 << 4)));
        puVar14 = (pCVar31->u).l.savedpc;
      }
      pcVar16 = (code *)(puVar14 + ((ulong)(uVar35 >> 0xe) - 0x1fffe));
    }
    else {
      if ((iVar29 != 0) && ((iVar29 != 1 || (iVar29 = 1, pVVar7->b != 0)))) goto LAB_001137ff;
LAB_001137d5:
      pcVar16 = (pCVar31->u).c.k + 4;
    }
    goto LAB_0011384c;
  case 0x1d:
    if (0x7fffff < uVar35) {
      L->top = (StkId)((long)&pTVar27->value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0));
    }
    uVar35 = uVar35 >> 0xe & 0x1ff;
    iVar29 = luaD_precall(L,pTVar27,uVar35 - 1);
    if (iVar29 == 0) {
      pCVar31 = L->ci;
      pCVar31->callstatus = pCVar31->callstatus | 4;
      goto LAB_00112697;
    }
    if (uVar35 != 0) goto LAB_00113606;
    break;
  case 0x1e:
    if (0x7fffff < uVar35) {
      L->top = (StkId)((long)&pTVar27->value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0));
    }
    iVar29 = luaD_precall(L,pTVar27,-1);
    if (iVar29 != 0) {
      pTVar18 = (pCVar31->u).l.base;
      goto LAB_001126b8;
    }
    pCVar34 = L->ci;
    pTVar18 = pCVar34->func;
    pCVar31 = pCVar34->previous;
    pTVar5 = pCVar31->func;
    pTVar15 = (pCVar34->u).l.base + *(byte *)(*(long *)((pTVar18->value_).f + 0x18) + 0x78);
    if (0 < *(int *)(*(long *)(p_Var4 + 0x18) + 0x60)) {
      luaF_close(L,(pCVar31->u).l.base);
    }
    if (pTVar18 < pTVar15) {
      piVar17 = &pTVar5->tt_;
      pTVar22 = pTVar18;
      do {
        ((TValue *)(piVar17 + -2))->value_ = pTVar22->value_;
        *piVar17 = pTVar22->tt_;
        pTVar22 = pTVar22 + 1;
        piVar17 = piVar17 + 4;
      } while (pTVar22 < pTVar15);
    }
    (pCVar31->u).l.base = (StkId)(((long)(pCVar34->u).l.base - (long)pTVar18) + (long)pTVar5);
    pTVar18 = (StkId)((long)L->top + ((long)pTVar5 - (long)pTVar18));
    L->top = pTVar18;
    pCVar31->top = pTVar18;
    (pCVar31->u).l.savedpc = (pCVar34->u).l.savedpc;
    pCVar31->callstatus = pCVar31->callstatus | 0x40;
    L->ci = pCVar31;
    goto LAB_00112697;
  case 0x1f:
    goto switchD_00112807_caseD_1f;
  case 0x20:
    dVar38 = (pTVar27->value_).n + pTVar27[2].value_.n;
    if (pTVar27[2].value_.n <= 0.0) {
      if (dVar38 < pTVar27[1].value_.n) goto LAB_001126b8;
    }
    else if (pTVar27[1].value_.n < dVar38) goto LAB_001126b8;
    (pCVar31->u).l.savedpc = (pCVar31->u).l.savedpc + ((ulong)(uVar35 >> 0xe) - 0x1ffff);
    (pTVar27->value_).n = dVar38;
    pTVar27->tt_ = 3;
    pTVar27[3].value_.n = dVar38;
    pTVar27[3].tt_ = 3;
    goto LAB_001126b8;
  case 0x21:
    if ((pTVar27->tt_ != 3) && (pTVar11 = luaV_tonumber(pTVar27,pTVar27), pTVar11 == (TValue *)0x0))
    {
      fmt = "\'for\' initial value must be a number";
LAB_001139d6:
      luaG_runerror(L,fmt);
    }
    if ((pTVar27[1].tt_ != 3) &&
       (pTVar11 = luaV_tonumber(pTVar27 + 1,pTVar27 + 1), pTVar11 == (TValue *)0x0)) {
      fmt = "\'for\' limit must be a number";
      goto LAB_001139d6;
    }
    pTVar11 = pTVar27 + 2;
    if ((pTVar27[2].tt_ != 3) &&
       (pTVar11 = luaV_tonumber(pTVar11,pTVar11), pTVar11 == (TValue *)0x0)) {
      fmt = "\'for\' step must be a number";
      goto LAB_001139d6;
    }
    (pTVar27->value_).n = (pTVar27->value_).n - (pTVar11->value_).n;
    pTVar27->tt_ = 3;
    goto LAB_00113398;
  case 0x22:
    pTVar27[5].value_ = pTVar27[2].value_;
    pTVar27[5].tt_ = pTVar27[2].tt_;
    pTVar27[4].value_ = pTVar27[1].value_;
    pTVar27[4].tt_ = pTVar27[1].tt_;
    pTVar27[3].value_ = pTVar27->value_;
    pTVar27[3].tt_ = pTVar27->tt_;
    L->top = pTVar27 + 6;
    luaD_call(L,pTVar27 + 3,uVar35 >> 0xe & 0x1ff,1);
    pTVar18 = (pCVar31->u).l.base;
    L->top = pCVar31->top;
    puVar14 = (pCVar31->u).l.savedpc;
    (pCVar31->u).l.savedpc = puVar14 + 1;
    uVar35 = *puVar14;
    pTVar27 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar35 >> 2 & 0xff0));
  case 0x23:
    iVar29 = pTVar27[1].tt_;
    if (iVar29 != 0) {
      pTVar27->value_ = pTVar27[1].value_;
      pTVar27->tt_ = iVar29;
LAB_00113398:
      pcVar16 = (code *)((pCVar31->u).l.savedpc + ((ulong)(uVar35 >> 0xe) - 0x1ffff));
LAB_0011384c:
      (pCVar31->u).l.savedpc = (Instruction *)pcVar16;
    }
    goto LAB_001126b8;
  case 0x24:
    if (uVar35 < 0x800000) {
      uVar26 = (int)((ulong)((long)L->top - (long)pTVar27) >> 4) - 1;
    }
    else {
      uVar26 = uVar35 >> 0x17;
    }
    uVar35 = uVar35 >> 0xe & 0x1ff;
    if (uVar35 == 0) {
      puVar14 = (pCVar31->u).l.savedpc;
      (pCVar31->u).l.savedpc = puVar14 + 1;
      uVar35 = *puVar14 >> 6;
    }
    pGVar12 = (pTVar27->value_).gc;
    iVar29 = uVar35 * 0x32 + uVar26 + -0x32;
    if ((pGVar12->h).sizearray < iVar29) {
      luaH_resizearray(L,&pGVar12->h,iVar29);
    }
    if (0 < (int)uVar26) {
      pTVar27 = (TValue *)((long)&pTVar18[uVar26].value_ + (ulong)(uVar33 << 4));
      uVar28 = (ulong)uVar26;
      do {
        luaH_setint(L,&pGVar12->h,uVar35 * 0x32 + -0x32 + (int)uVar28,pTVar27);
        if ((((pTVar27->tt_ & 0x40) != 0) && (((byte)(pTVar27->value_).f[9] & 3) != 0)) &&
           (((pGVar12->gch).marked & 4) != 0)) {
          luaC_barrierback_(L,pGVar12);
        }
        pTVar27 = pTVar27 + -1;
        bVar8 = 1 < (long)uVar28;
        uVar28 = uVar28 - 1;
      } while (bVar8);
    }
    L->top = pCVar31->top;
    goto LAB_001126b8;
  case 0x25:
    p = *(global_State **)(*(long *)(*(long *)(p_Var4 + 0x18) + 0x20) + (ulong)(uVar35 >> 0xe) * 8);
    pUVar6 = *(Upvaldesc **)&(p->strt).nuse;
    pGVar12 = (p->l_registry).value_.gc;
    uVar35 = p->seed;
    if (pGVar12 == (GCObject *)0x0) {
LAB_00113553:
      pGVar12 = (GCObject *)luaF_newLclosure(L,uVar35);
      (pGVar12->th).l_G = p;
      (pTVar27->value_).gc = pGVar12;
      pTVar27->tt_ = 0x46;
      if (0 < (int)uVar35) {
        lVar25 = 0;
        do {
          if ((&pUVar6->instack)[lVar25 * 2] == '\0') {
            pUVar13 = *(UpVal **)(p_Var4 + (ulong)(&pUVar6->idx)[lVar25 * 2] * 8 + 0x20);
          }
          else {
            pUVar13 = luaF_findupval(L,pTVar18 + (&pUVar6->idx)[lVar25 * 2]);
          }
          *(UpVal **)((long)pGVar12 + lVar25 + 0x20) = pUVar13;
          lVar25 = lVar25 + 8;
        } while ((ulong)uVar35 << 3 != lVar25);
      }
      if (((ulong)p->ud & 0x400) != 0) {
        luaC_barrierproto_(L,(Proto *)p,&pGVar12->cl);
      }
      (p->l_registry).value_.gc = pGVar12;
    }
    else {
      if (0 < (int)uVar35) {
        lVar25 = 0;
        do {
          if ((&pUVar6->instack)[lVar25 * 2] == '\0') {
            pTVar15 = *(StkId *)(*(long *)(p_Var4 + (ulong)(&pUVar6->idx)[lVar25 * 2] * 8 + 0x20) +
                                0x10);
          }
          else {
            pTVar15 = pTVar18 + (&pUVar6->idx)[lVar25 * 2];
          }
          if (*(StkId *)(*(long *)((long)pGVar12 + lVar25 + 0x20) + 0x10) != pTVar15)
          goto LAB_00113553;
          lVar25 = lVar25 + 8;
        } while ((ulong)uVar35 * 8 - lVar25 != 0);
      }
      (pTVar27->value_).gc = pGVar12;
      pTVar27->tt_ = 0x46;
    }
    if (0 < L->l_G->GCdebt) {
      L->top = pTVar27 + 1;
      luaC_step(L);
LAB_00113606:
      L->top = pCVar31->top;
    }
    break;
  case 0x26:
    uVar26 = ~(uint)*(byte *)(*(long *)(p_Var4 + 0x18) + 0x78) +
             (int)((ulong)((long)pTVar18 - (long)pCVar31->func) >> 4);
    lVar25 = (long)(int)uVar26;
    if (uVar35 < 0x800000) {
      if ((long)L->stack_last - (long)L->top >> 4 <= lVar25) {
        luaD_growstack(L,uVar26);
      }
      pTVar18 = (pCVar31->u).l.base;
      pTVar27 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 << 4));
      L->top = pTVar27 + lVar25;
    }
    else {
      uVar26 = (uVar35 >> 0x17) - 1;
    }
    if (0 < (int)uVar26) {
      lVar24 = 8;
      uVar28 = 0;
      do {
        if ((long)uVar28 < lVar25) {
          *(undefined8 *)((long)pTVar27 + lVar24 + -8) =
               *(undefined8 *)((long)pTVar18 + lVar24 + lVar25 * -0x10 + -8);
          *(undefined4 *)((long)&pTVar27->value_ + lVar24) =
               *(undefined4 *)((long)&pTVar18[-lVar25].value_ + lVar24);
        }
        else {
          *(undefined4 *)((long)&pTVar27->value_ + lVar24) = 0;
        }
        uVar28 = uVar28 + 1;
        lVar24 = lVar24 + 0x10;
      } while (uVar26 != uVar28);
    }
    goto LAB_001126b8;
  }
  pTVar18 = (pCVar31->u).l.base;
  goto LAB_001126b8;
switchD_00112807_caseD_1f:
  if (0x7fffff < uVar35) {
    L->top = (StkId)((long)&pTVar27[-1].value_ + (ulong)(uVar35 >> 0x13 & 0xfffffff0));
  }
  if (0 < *(int *)(*(long *)(p_Var4 + 0x18) + 0x60)) {
    luaF_close(L,pTVar18);
  }
  iVar29 = luaD_poscall(L,pTVar27);
  if ((pCVar31->callstatus & 4) == 0) {
    return;
  }
  pCVar31 = L->ci;
  if (iVar29 != 0) {
    L->top = pCVar31->top;
  }
  goto LAB_00112697;
}

Assistant:

void luaV_execute (lua_State *L) {
  CallInfo *ci = L->ci;
  LClosure *cl;
  TValue *k;
  StkId base;
 newframe:  /* reentry point when frame changes (call/return) */
  lua_assert(ci == L->ci);
  cl = clLvalue(ci->func);
  k = cl->p->k;
  base = ci->u.l.base;
  /* main loop of interpreter */
  for (;;) {
    Instruction i = *(ci->u.l.savedpc++);
    StkId ra;
    if ((L->hookmask & (LUA_MASKLINE | LUA_MASKCOUNT)) &&
        (--L->hookcount == 0 || L->hookmask & LUA_MASKLINE)) {
      Protect(traceexec(L));
    }
    /* WARNING: several calls may realloc the stack and invalidate `ra' */
    ra = RA(i);
    lua_assert(base == ci->u.l.base);
    lua_assert(base <= L->top && L->top < L->stack + L->stacksize);
    vmdispatch (GET_OPCODE(i)) {
      vmcase(OP_MOVE,
        setobjs2s(L, ra, RB(i));
      )
      vmcase(OP_LOADK,
        TValue *rb = k + GETARG_Bx(i);
        setobj2s(L, ra, rb);
      )
      vmcase(OP_LOADKX,
        TValue *rb;
        lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_EXTRAARG);
        rb = k + GETARG_Ax(*ci->u.l.savedpc++);
        setobj2s(L, ra, rb);
      )
      vmcase(OP_LOADBOOL,
        setbvalue(ra, GETARG_B(i));
        if (GETARG_C(i)) ci->u.l.savedpc++;  /* skip next instruction (if C) */
      )
      vmcase(OP_LOADNIL,
        int b = GETARG_B(i);
        do {
          setnilvalue(ra++);
        } while (b--);
      )
      vmcase(OP_GETUPVAL,
        int b = GETARG_B(i);
        setobj2s(L, ra, cl->upvals[b]->v);
      )
      vmcase(OP_GETTABUP,
        int b = GETARG_B(i);
        Protect(luaV_gettable(L, cl->upvals[b]->v, RKC(i), ra));
      )
      vmcase(OP_GETTABLE,
        Protect(luaV_gettable(L, RB(i), RKC(i), ra));
      )
      vmcase(OP_SETTABUP,
        int a = GETARG_A(i);
        Protect(luaV_settable(L, cl->upvals[a]->v, RKB(i), RKC(i)));
      )
      vmcase(OP_SETUPVAL,
        UpVal *uv = cl->upvals[GETARG_B(i)];
        setobj(L, uv->v, ra);
        luaC_barrier(L, uv, ra);
      )
      vmcase(OP_SETTABLE,
        Protect(luaV_settable(L, ra, RKB(i), RKC(i)));
      )
      vmcase(OP_NEWTABLE,
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        Table *t = luaH_new(L);
        sethvalue(L, ra, t);
        if (b != 0 || c != 0)
          luaH_resize(L, t, luaO_fb2int(b), luaO_fb2int(c));
        checkGC(L, ra + 1);
      )
      vmcase(OP_SELF,
        StkId rb = RB(i);
        setobjs2s(L, ra+1, rb);
        Protect(luaV_gettable(L, rb, RKC(i), ra));
      )
      vmcase(OP_ADD,
        arith_op(luai_numadd, TM_ADD);
      )
      vmcase(OP_SUB,
        arith_op(luai_numsub, TM_SUB);
      )
      vmcase(OP_MUL,
        arith_op(luai_nummul, TM_MUL);
      )
      vmcase(OP_DIV,
        arith_op(luai_numdiv, TM_DIV);
      )
      vmcase(OP_MOD,
        arith_op(luai_nummod, TM_MOD);
      )
      vmcase(OP_POW,
        arith_op(luai_numpow, TM_POW);
      )
      vmcase(OP_UNM,
        TValue *rb = RB(i);
        if (ttisnumber(rb)) {
          lua_Number nb = nvalue(rb);
          setnvalue(ra, luai_numunm(L, nb));
        }
        else {
          Protect(luaV_arith(L, ra, rb, rb, TM_UNM));
        }
      )
      vmcase(OP_NOT,
        TValue *rb = RB(i);
        int res = l_isfalse(rb);  /* next assignment may change this value */
        setbvalue(ra, res);
      )
      vmcase(OP_LEN,
        Protect(luaV_objlen(L, ra, RB(i)));
      )
      vmcase(OP_CONCAT,
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        StkId rb;
        L->top = base + c + 1;  /* mark the end of concat operands */
        Protect(luaV_concat(L, c - b + 1));
        ra = RA(i);  /* 'luav_concat' may invoke TMs and move the stack */
        rb = b + base;
        setobjs2s(L, ra, rb);
        checkGC(L, (ra >= rb ? ra + 1 : rb));
        L->top = ci->top;  /* restore top */
      )
      vmcase(OP_JMP,
        dojump(ci, i, 0);
      )
      vmcase(OP_EQ,
        TValue *rb = RKB(i);
        TValue *rc = RKC(i);
        Protect(
          if (cast_int(equalobj(L, rb, rc)) != GETARG_A(i))
            ci->u.l.savedpc++;
          else
            donextjump(ci);
        )
      )
      vmcase(OP_LT,
        Protect(
          if (luaV_lessthan(L, RKB(i), RKC(i)) != GETARG_A(i))
            ci->u.l.savedpc++;
          else
            donextjump(ci);
        )
      )
      vmcase(OP_LE,
        Protect(
          if (luaV_lessequal(L, RKB(i), RKC(i)) != GETARG_A(i))
            ci->u.l.savedpc++;
          else
            donextjump(ci);
        )
      )
      vmcase(OP_TEST,
        if (GETARG_C(i) ? l_isfalse(ra) : !l_isfalse(ra))
            ci->u.l.savedpc++;
          else
          donextjump(ci);
      )
      vmcase(OP_TESTSET,
        TValue *rb = RB(i);
        if (GETARG_C(i) ? l_isfalse(rb) : !l_isfalse(rb))
          ci->u.l.savedpc++;
        else {
          setobjs2s(L, ra, rb);
          donextjump(ci);
        }
      )
      vmcase(OP_CALL,
        int b = GETARG_B(i);
        int nresults = GETARG_C(i) - 1;
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        if (luaD_precall(L, ra, nresults)) {  /* C function? */
          if (nresults >= 0) L->top = ci->top;  /* adjust results */
          base = ci->u.l.base;
        }
        else {  /* Lua function */
          ci = L->ci;
          ci->callstatus |= CIST_REENTRY;
          goto newframe;  /* restart luaV_execute over new Lua function */
        }
      )
      vmcase(OP_TAILCALL,
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        lua_assert(GETARG_C(i) - 1 == LUA_MULTRET);
        if (luaD_precall(L, ra, LUA_MULTRET))  /* C function? */
          base = ci->u.l.base;
        else {
          /* tail call: put called frame (n) in place of caller one (o) */
          CallInfo *nci = L->ci;  /* called frame */
          CallInfo *oci = nci->previous;  /* caller frame */
          StkId nfunc = nci->func;  /* called function */
          StkId ofunc = oci->func;  /* caller function */
          /* last stack slot filled by 'precall' */
          StkId lim = nci->u.l.base + getproto(nfunc)->numparams;
          int aux;
          /* close all upvalues from previous call */
          if (cl->p->sizep > 0) luaF_close(L, oci->u.l.base);
          /* move new frame into old one */
          for (aux = 0; nfunc + aux < lim; aux++)
            setobjs2s(L, ofunc + aux, nfunc + aux);
          oci->u.l.base = ofunc + (nci->u.l.base - nfunc);  /* correct base */
          oci->top = L->top = ofunc + (L->top - nfunc);  /* correct top */
          oci->u.l.savedpc = nci->u.l.savedpc;
          oci->callstatus |= CIST_TAIL;  /* function was tail called */
          ci = L->ci = oci;  /* remove new frame */
          lua_assert(L->top == oci->u.l.base + getproto(ofunc)->maxstacksize);
          goto newframe;  /* restart luaV_execute over new Lua function */
        }
      )
      vmcasenb(OP_RETURN,
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b-1;
        if (cl->p->sizep > 0) luaF_close(L, base);
        b = luaD_poscall(L, ra);
        if (!(ci->callstatus & CIST_REENTRY))  /* 'ci' still the called one */
          return;  /* external invocation: return */
        else {  /* invocation via reentry: continue execution */
          ci = L->ci;
          if (b) L->top = ci->top;
          lua_assert(isLua(ci));
          lua_assert(GET_OPCODE(*((ci)->u.l.savedpc - 1)) == OP_CALL);
          goto newframe;  /* restart luaV_execute over new Lua function */
        }
      )
      vmcase(OP_FORLOOP,
        lua_Number step = nvalue(ra+2);
        lua_Number idx = luai_numadd(L, nvalue(ra), step); /* increment index */
        lua_Number limit = nvalue(ra+1);
        if (luai_numlt(L, 0, step) ? luai_numle(L, idx, limit)
                                   : luai_numle(L, limit, idx)) {
          ci->u.l.savedpc += GETARG_sBx(i);  /* jump back */
          setnvalue(ra, idx);  /* update internal index... */
          setnvalue(ra+3, idx);  /* ...and external index */
        }
      )
      vmcase(OP_FORPREP,
        const TValue *init = ra;
        const TValue *plimit = ra+1;
        const TValue *pstep = ra+2;
        if (!tonumber(init, ra))
          luaG_runerror(L, LUA_QL("for") " initial value must be a number");
        else if (!tonumber(plimit, ra+1))
          luaG_runerror(L, LUA_QL("for") " limit must be a number");
        else if (!tonumber(pstep, ra+2))
          luaG_runerror(L, LUA_QL("for") " step must be a number");
        setnvalue(ra, luai_numsub(L, nvalue(ra), nvalue(pstep)));
        ci->u.l.savedpc += GETARG_sBx(i);
      )
      vmcasenb(OP_TFORCALL,
        StkId cb = ra + 3;  /* call base */
        setobjs2s(L, cb+2, ra+2);
        setobjs2s(L, cb+1, ra+1);
        setobjs2s(L, cb, ra);
        L->top = cb + 3;  /* func. + 2 args (state and index) */
        Protect(luaD_call(L, cb, GETARG_C(i), 1));
        L->top = ci->top;
        i = *(ci->u.l.savedpc++);  /* go to next instruction */
        ra = RA(i);
        lua_assert(GET_OPCODE(i) == OP_TFORLOOP);
        goto l_tforloop;
      )
      vmcase(OP_TFORLOOP,
        l_tforloop:
        if (!ttisnil(ra + 1)) {  /* continue loop? */
          setobjs2s(L, ra, ra + 1);  /* save control variable */
           ci->u.l.savedpc += GETARG_sBx(i);  /* jump back */
        }
      )
      vmcase(OP_SETLIST,
        int n = GETARG_B(i);
        int c = GETARG_C(i);
        int last;
        Table *h;
        if (n == 0) n = cast_int(L->top - ra) - 1;
        if (c == 0) {
          lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_EXTRAARG);
          c = GETARG_Ax(*ci->u.l.savedpc++);
        }
        luai_runtimecheck(L, ttistable(ra));
        h = hvalue(ra);
        last = ((c-1)*LFIELDS_PER_FLUSH) + n;
        if (last > h->sizearray)  /* needs more space? */
          luaH_resizearray(L, h, last);  /* pre-allocate it at once */
        for (; n > 0; n--) {
          TValue *val = ra+n;
          luaH_setint(L, h, last--, val);
          luaC_barrierback(L, obj2gco(h), val);
        }
        L->top = ci->top;  /* correct top (in case of previous open call) */
      )
      vmcase(OP_CLOSURE,
        Proto *p = cl->p->p[GETARG_Bx(i)];
        Closure *ncl = getcached(p, cl->upvals, base);  /* cached closure */
        if (ncl == NULL)  /* no match? */
          pushclosure(L, p, cl->upvals, base, ra);  /* create a new one */
        else
          setclLvalue(L, ra, ncl);  /* push cashed closure */
        checkGC(L, ra + 1);
      )
      vmcase(OP_VARARG,
        int b = GETARG_B(i) - 1;
        int j;
        int n = cast_int(base - ci->func) - cl->p->numparams - 1;
        if (b < 0) {  /* B == 0? */
          b = n;  /* get all var. arguments */
          Protect(luaD_checkstack(L, n));
          ra = RA(i);  /* previous call may change the stack */
          L->top = ra + n;
        }
        for (j = 0; j < b; j++) {
          if (j < n) {
            setobjs2s(L, ra + j, base - n + j);
          }
          else {
            setnilvalue(ra + j);
          }
        }
      )
      vmcase(OP_EXTRAARG,
        lua_assert(0);
      )
    }
  }
}